

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_ahead_log.cpp
# Opt level: O3

void __thiscall duckdb::WriteAheadLog::WriteVersion(WriteAheadLog *this)

{
  pointer this_00;
  idx_t iVar1;
  type stream;
  BinarySerializer serializer;
  SerializationOptions local_578;
  BinarySerializer local_538;
  
  this_00 = unique_ptr<duckdb::BufferedFileWriter,_std::default_delete<duckdb::BufferedFileWriter>,_true>
            ::operator->(&this->writer);
  iVar1 = BufferedFileWriter::GetFileSize(this_00);
  if (iVar1 == 0) {
    stream = unique_ptr<duckdb::BufferedFileWriter,_std::default_delete<duckdb::BufferedFileWriter>,_true>
             ::operator*(&this->writer);
    local_578.serialize_enum_as_string = false;
    local_578.serialize_default_values = false;
    local_578._2_6_ = 0;
    local_578.serialization_compatibility.duckdb_version._M_dataplus._M_p = (pointer)0x0;
    local_578.serialization_compatibility.duckdb_version._M_string_length = 0;
    local_578.serialization_compatibility.duckdb_version.field_2._M_allocated_capacity = 0;
    local_578.serialization_compatibility.duckdb_version.field_2._8_8_ = 0;
    local_578.serialization_compatibility.serialization_version = 0;
    local_578.serialization_compatibility.manually_set = false;
    local_578.serialization_compatibility._41_7_ = 0;
    SerializationCompatibility::Default();
    BinarySerializer::BinarySerializer(&local_538,&stream->super_WriteStream,&local_578);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_578.serialization_compatibility.duckdb_version._M_dataplus._M_p !=
        &local_578.serialization_compatibility.duckdb_version.field_2) {
      operator_delete(local_578.serialization_compatibility.duckdb_version._M_dataplus._M_p);
    }
    BinarySerializer::OnObjectBegin(&local_538);
    (*local_538.super_Serializer._vptr_Serializer[2])(&local_538,100,"wal_type");
    Serializer::WriteValue<duckdb::WALType>(&local_538.super_Serializer,WAL_VERSION);
    (*local_538.super_Serializer._vptr_Serializer[3])();
    (*local_538.super_Serializer._vptr_Serializer[2])(&local_538,0x65,"version");
    (*local_538.super_Serializer._vptr_Serializer[0x15])(&local_538,2);
    (*local_538.super_Serializer._vptr_Serializer[3])();
    BinarySerializer::OnObjectEnd(&local_538);
    local_538.super_Serializer._vptr_Serializer = (_func_int **)&PTR__BinarySerializer_019677d8;
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::stack<std::reference_wrapper<duckdb::SerializationData::CustomData>,_std::deque<std::reference_wrapper<duckdb::SerializationData::CustomData>,_std::allocator<std::reference_wrapper<duckdb::SerializationData::CustomData>_>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::stack<std::reference_wrapper<duckdb::SerializationData::CustomData>,_std::deque<std::reference_wrapper<duckdb::SerializationData::CustomData>,_std::allocator<std::reference_wrapper<duckdb::SerializationData::CustomData>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&local_538.data.customs._M_h);
    ::std::
    _Deque_base<std::reference_wrapper<const_duckdb::CompressionInfo>,_std::allocator<std::reference_wrapper<const_duckdb::CompressionInfo>_>_>
    ::~_Deque_base((_Deque_base<std::reference_wrapper<const_duckdb::CompressionInfo>,_std::allocator<std::reference_wrapper<const_duckdb::CompressionInfo>_>_>
                    *)&local_538.data.compression_infos);
    ::std::
    _Deque_base<std::reference_wrapper<const_duckdb::LogicalType>,_std::allocator<std::reference_wrapper<const_duckdb::LogicalType>_>_>
    ::~_Deque_base((_Deque_base<std::reference_wrapper<const_duckdb::LogicalType>,_std::allocator<std::reference_wrapper<const_duckdb::LogicalType>_>_>
                    *)&local_538.data.types);
    ::std::
    _Deque_base<std::reference_wrapper<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>_>_>_>_>,_std::allocator<std::reference_wrapper<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>_>_>_>_>_>_>
    ::~_Deque_base((_Deque_base<std::reference_wrapper<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>_>_>_>_>,_std::allocator<std::reference_wrapper<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>_>_>_>_>_>_>
                    *)&local_538.data.parameter_data);
    ::std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Deque_base
              ((_Deque_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_538.data.enums);
    ::std::
    _Deque_base<std::reference_wrapper<duckdb::Catalog>,_std::allocator<std::reference_wrapper<duckdb::Catalog>_>_>
    ::~_Deque_base((_Deque_base<std::reference_wrapper<duckdb::Catalog>,_std::allocator<std::reference_wrapper<duckdb::Catalog>_>_>
                    *)&local_538.data.catalogs);
    ::std::
    _Deque_base<std::reference_wrapper<duckdb::DatabaseInstance>,_std::allocator<std::reference_wrapper<duckdb::DatabaseInstance>_>_>
    ::~_Deque_base((_Deque_base<std::reference_wrapper<duckdb::DatabaseInstance>,_std::allocator<std::reference_wrapper<duckdb::DatabaseInstance>_>_>
                    *)&local_538.data.databases);
    ::std::
    _Deque_base<std::reference_wrapper<duckdb::ClientContext>,_std::allocator<std::reference_wrapper<duckdb::ClientContext>_>_>
    ::~_Deque_base((_Deque_base<std::reference_wrapper<duckdb::ClientContext>,_std::allocator<std::reference_wrapper<duckdb::ClientContext>_>_>
                    *)&local_538.data);
    ::std::
    vector<duckdb::BinarySerializer::DebugState,_std::allocator<duckdb::BinarySerializer::DebugState>_>
    ::~vector(&local_538.debug_stack.
               super_vector<duckdb::BinarySerializer::DebugState,_std::allocator<duckdb::BinarySerializer::DebugState>_>
             );
    Serializer::~Serializer(&local_538.super_Serializer);
  }
  return;
}

Assistant:

void WriteAheadLog::WriteVersion() {
	D_ASSERT(writer);
	if (writer->GetFileSize() > 0) {
		// already written - no need to write a version marker
		return;
	}
	// write the version marker
	// note that we explicitly do not checksum the version entry
	BinarySerializer serializer(*writer);
	serializer.Begin();
	serializer.WriteProperty(100, "wal_type", WALType::WAL_VERSION);
	serializer.WriteProperty(101, "version", idx_t(WAL_VERSION_NUMBER));
	serializer.End();
}